

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucs2fontmap.c
# Opt level: O3

int encoding_number(char *enc)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (enc != (char *)0x0) {
    iVar1 = strncmp(enc,"iso10646-1",10);
    uVar2 = 0;
    if (iVar1 != 0) {
      iVar1 = strcmp(enc,"iso8859-1");
      if (iVar1 == 0) {
        uVar2 = 1;
      }
      else {
        iVar1 = strcmp(enc,"iso8859-2");
        if (iVar1 == 0) {
          uVar2 = 2;
        }
        else {
          iVar1 = strcmp(enc,"iso8859-3");
          if (iVar1 == 0) {
            uVar2 = 3;
          }
          else {
            iVar1 = strcmp(enc,"iso8859-4");
            if (iVar1 == 0) {
              uVar2 = 4;
            }
            else {
              iVar1 = strcmp(enc,"iso8859-5");
              if (iVar1 == 0) {
                uVar2 = 5;
              }
              else {
                iVar1 = strcmp(enc,"iso8859-6");
                if (iVar1 == 0) {
                  uVar2 = 6;
                }
                else {
                  iVar1 = strcmp(enc,"iso8859-7");
                  if (iVar1 == 0) {
                    uVar2 = 7;
                  }
                  else {
                    iVar1 = strcmp(enc,"iso8859-8");
                    if (iVar1 == 0) {
                      uVar2 = 8;
                    }
                    else {
                      iVar1 = strcmp(enc,"iso8859-9");
                      if (iVar1 == 0) {
                        uVar2 = 9;
                      }
                      else {
                        iVar1 = strcmp(enc,"iso8859-10");
                        if (iVar1 == 0) {
                          uVar2 = 10;
                        }
                        else {
                          iVar1 = strcmp(enc,"iso8859-13");
                          if (iVar1 == 0) {
                            uVar2 = 0xb;
                          }
                          else {
                            iVar1 = strcmp(enc,"iso8859-14");
                            if (iVar1 == 0) {
                              uVar2 = 0xc;
                            }
                            else {
                              iVar1 = strcmp(enc,"iso8859-15");
                              if (iVar1 == 0) {
                                uVar2 = 0xd;
                              }
                              else {
                                iVar1 = strcmp(enc,"koi8-r");
                                if (iVar1 == 0) {
                                  uVar2 = 0xe;
                                }
                                else {
                                  iVar1 = strcmp(enc,"big5-0");
                                  uVar2 = 0xf;
                                  if (iVar1 != 0) {
                                    iVar1 = strcmp(enc,"big5.eten-0");
                                    if (iVar1 != 0) {
                                      iVar1 = strcmp(enc,"big5p-0");
                                      if (iVar1 != 0) {
                                        iVar1 = strcmp(enc,"ksc5601.1987-0");
                                        if (iVar1 == 0) {
                                          uVar2 = 0x10;
                                        }
                                        else {
                                          iVar1 = strcmp(enc,"gb2312.1980-0");
                                          uVar2 = 0x11;
                                          if (iVar1 != 0) {
                                            iVar1 = strcmp(enc,"gb2312.80-0");
                                            if (iVar1 != 0) {
                                              iVar1 = strcmp(enc,"gb2312.80&gb8565.88");
                                              if (iVar1 != 0) {
                                                iVar1 = strcmp(enc,"jisx0201.1976-0");
                                                if (iVar1 == 0) {
                                                  uVar2 = 0x12;
                                                }
                                                else {
                                                  iVar1 = strcmp(enc,"jisx0208.1983-0");
                                                  uVar2 = 0x13;
                                                  if (iVar1 != 0) {
                                                    iVar1 = strcmp(enc,"jisx0208.1990-0");
                                                    if (iVar1 != 0) {
                                                      iVar1 = strcmp(enc,"jisx0208.1978-0");
                                                      if (iVar1 != 0) {
                                                        iVar1 = strcmp(enc,"jisx0212.1990-0");
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x14;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(enc,"symbol");
                                                          if (iVar1 == 0) {
                                                            uVar2 = 0x15;
                                                          }
                                                          else {
                                                            iVar1 = strcmp(enc,"dingbats");
                                                            uVar2 = 0x16;
                                                            if (iVar1 != 0) {
                                                              iVar1 = strcmp(enc,"zapfdingbats");
                                                              if (iVar1 != 0) {
                                                                iVar1 = strcmp(enc,"zapf dingbats");
                                                                if (iVar1 != 0) {
                                                                  iVar1 = strcmp(enc,
                                                  "itc zapf dingbats");
                                                  if (iVar1 != 0) {
                                                    iVar1 = strcmp(enc,"koi8-u");
                                                    if (iVar1 == 0) {
                                                      uVar2 = 0x17;
                                                    }
                                                    else {
                                                      iVar1 = strcmp(enc,"microsoft-cp1251");
                                                      if (iVar1 == 0) {
                                                        uVar2 = 0x18;
                                                      }
                                                      else {
                                                        iVar1 = strcmp(enc,"iso8859-11");
                                                        if (iVar1 == 0) {
                                                          uVar2 = 0x19;
                                                        }
                                                        else {
                                                          iVar1 = strcmp(enc,"gbk-0");
                                                          uVar2 = 0x1a;
                                                          if (iVar1 != 0) {
                                                            iVar1 = strcmp(enc,"cp936");
                                                            if (iVar1 != 0) {
                                                              iVar1 = strcmp(enc,"gbk");
                                                              uVar2 = -(uint)(iVar1 != 0) | 0x1a;
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int encoding_number(const char *enc) {
  if (!enc || !strncmp(enc, "iso10646-1", 10)) {
    return 0;
  } else if (!strcmp(enc, "iso8859-1")) {
    return 1;
  } else if (!strcmp(enc, "iso8859-2")) {
    return 2;
  } else if (!strcmp(enc, "iso8859-3")) {
    return 3;
  } else if (!strcmp(enc, "iso8859-4")) {
    return 4;
  } else if (!strcmp(enc, "iso8859-5")) {
    return 5;
  } else if (!strcmp(enc, "iso8859-6")) {
    return 6;
  } else if (!strcmp(enc, "iso8859-7")) {
    return 7;
  } else if (!strcmp(enc, "iso8859-8")) {
    return 8;
  } else if (!strcmp(enc, "iso8859-9")) {
    return 9;
  } else if (!strcmp(enc, "iso8859-10")) {
    return 10;
  } else if (!strcmp(enc, "iso8859-13")) {
    return 11;
  } else if (!strcmp(enc, "iso8859-14")) {
    return 12;
  } else if (!strcmp(enc, "iso8859-15")) {
    return 13;
  } else if (!strcmp(enc, "koi8-r")) {
    return 14;
  } else if (!strcmp(enc, "big5-0") || !strcmp(enc, "big5.eten-0") ||
    !strcmp(enc, "big5p-0")) 
  {
    return 15;
  } else if (!strcmp(enc, "ksc5601.1987-0")) {
    return 16;
  } else if (!strcmp(enc, "gb2312.1980-0") || !strcmp(enc, "gb2312.80-0") || 
     !strcmp(enc, "gb2312.80&gb8565.88") ||  !strcmp(enc, "gb2312.80-0")) 
  {
    return 17;
  } else if (!strcmp(enc, "jisx0201.1976-0")) {
    return 18;
  } else if (!strcmp(enc, "jisx0208.1983-0") || !strcmp(enc, "jisx0208.1990-0")
    || !strcmp(enc, "jisx0208.1978-0")) 
  {
    return 19;
  } else if (!strcmp(enc, "jisx0212.1990-0")) {
    return 20;
  } else if (!strcmp(enc, "symbol")) {
    return 21;
  } else if (!strcmp(enc, "dingbats") || !strcmp(enc, "zapfdingbats") || 
    !strcmp(enc, "zapf dingbats") || !strcmp(enc, "itc zapf dingbats")) 
  {
    return 22;
  } else if (!strcmp(enc, "koi8-u")) {
    return 23;
  } else if (!strcmp(enc, "microsoft-cp1251")) {
    return 24;
  } else if (!strcmp(enc, "iso8859-11")) {
    return 25;
  } else if (!strcmp(enc, "gbk-0") || !strcmp(enc, "cp936") || !strcmp(enc, "gbk")) {
    return 26;
  };
  return -1;
}